

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

void parseACOFile(filebuf *file)

{
  unsigned_short uVar1;
  long lVar2;
  reference this;
  value_type local_2e;
  unsigned_short local_2a;
  reference pvStack_28;
  uint16_t colorType;
  Rgba *color;
  uint8_t local_18;
  uint16_t i;
  uint16_t nbColors;
  char buf [10];
  filebuf *file_local;
  
  buf._2_8_ = file;
  lVar2 = std::streambuf::sgetn((char *)file,(long)&color + 6);
  if (lVar2 == 2) {
    uVar1 = readBE<unsigned_short,char>((char *)((long)&color + 6));
    if (uVar1 == 1) {
      lVar2 = std::streambuf::sgetn((char *)buf._2_8_,(long)&color + 6);
      if (lVar2 == 2) {
        color._4_2_ = readBE<unsigned_short,char>((char *)((long)&color + 6));
        if ((ushort)((ushort)options.nbColorsPerPal * (ushort)options.nbPalettes) < color._4_2_) {
          warning("ACO file contains %u colors, but there can only be %u; ignoring extra",
                  (ulong)color._4_2_,
                  (ulong)((uint)options.nbColorsPerPal * (uint)options.nbPalettes));
          color._4_2_ = (ushort)options.nbColorsPerPal * (ushort)options.nbPalettes;
        }
        std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::clear
                  (&options.palSpec);
        color._2_2_ = 0;
        while (color._2_2_ < color._4_2_) {
          lVar2 = std::streambuf::sgetn((char *)buf._2_8_,(long)&color + 6);
          if (lVar2 != 10) {
            error("Failed to read color #%u from palette file",(ulong)(color._2_2_ + 1));
            return;
          }
          if ((int)((ulong)color._2_2_ % (ulong)(long)(int)(uint)options.nbColorsPerPal) == 0) {
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
            emplace_back<>(&options.palSpec);
          }
          this = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::back
                           (&options.palSpec);
          pvStack_28 = std::array<Rgba,_4UL>::operator[]
                                 (this,(ulong)color._2_2_ % (ulong)options.nbColorsPerPal);
          local_2a = readBE<unsigned_short,char>((char *)((long)&color + 6));
          switch(local_2a) {
          case 0:
            Rgba::Rgba(&local_2e,color._6_1_,local_18,(uint8_t)i,0xff);
            *pvStack_28 = local_2e;
            color._2_2_ = color._2_2_ + 1;
            break;
          case 1:
            error("Unsupported color type (HSB) for ACO file");
            return;
          case 2:
            error("Unsupported color type (CMYK) for ACO file");
            return;
          default:
            error("Unknown color type (%u) for ACO file",(ulong)local_2a);
            return;
          case 7:
            error("Unsupported color type (lab) for ACO file");
            return;
          case 8:
            error("Unsupported color type (grayscale) for ACO file");
            return;
          }
        }
      }
      else {
        error("Couldn\'t read number of colors in palette file");
      }
    }
    else {
      error("Palette file does not appear to be an ACO file");
    }
  }
  else {
    error("Couldn\'t read ACO file version");
  }
  return;
}

Assistant:

static void parseACOFile(std::filebuf &file) {
	// https://www.adobe.com/devnet-apps/photoshop/fileformatashtml/#50577411_pgfId-1055819
	// http://www.nomodes.com/aco.html

	char buf[10];

	if (file.sgetn(buf, 2) != 2) {
		error("Couldn't read ACO file version");
		return;
	}
	if (readBE<uint16_t>(buf) != 1) {
		error("Palette file does not appear to be an ACO file");
		return;
	}

	if (file.sgetn(buf, 2) != 2) {
		error("Couldn't read number of colors in palette file");
		return;
	}
	uint16_t nbColors = readBE<uint16_t>(buf);

	if (nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("ACO file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();

	for (uint16_t i = 0; i < nbColors; ++i) {
		if (file.sgetn(buf, 10) != 10) {
			error("Failed to read color #%" PRIu16 " from palette file", i + 1);
			return;
		}

		if (i % options.nbColorsPerPal == 0) {
			options.palSpec.emplace_back();
		}

		Rgba &color = options.palSpec.back()[i % options.nbColorsPerPal];
		uint16_t colorType = readBE<uint16_t>(buf);
		switch (colorType) {
		case 0: // RGB
			color = Rgba(buf[0], buf[2], buf[4], 0xFF);
			break;
		case 1: // HSB
			error("Unsupported color type (HSB) for ACO file");
			return;
		case 2: // CMYK
			error("Unsupported color type (CMYK) for ACO file");
			return;
		case 7: // Lab
			error("Unsupported color type (lab) for ACO file");
			return;
		case 8: // Grayscale
			error("Unsupported color type (grayscale) for ACO file");
			return;
		default:
			error("Unknown color type (%" PRIu16 ") for ACO file", colorType);
			return;
		}
	}

	// TODO: maybe scan the v2 data instead (if present)
	// `codecvt` can be used to convert from UTF-16 to UTF-8
}